

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_ChangeTid(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  AActor **ppAVar1;
  uint uVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  AActor *pAVar7;
  char *pcVar8;
  bool bVar9;
  PClass *pPVar6;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_0042df4c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar7 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar7 != (AActor *)0x0) {
        pPVar6 = (pAVar7->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
          (pAVar7->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042df4c;
        }
        goto LAB_0042de8d;
      }
    }
    else if (pAVar7 != (AActor *)0x0) goto LAB_0042df3c;
    pAVar7 = (AActor *)0x0;
LAB_0042de8d:
    if (numparam == 1) {
      pcVar8 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        uVar2 = param[1].field_0.i;
        if ((pAVar7->tid != 0) && (pAVar7->iprev != (AActor **)0x0)) {
          pAVar3 = pAVar7->inext;
          *pAVar7->iprev = pAVar3;
          if (pAVar3 != (AActor *)0x0) {
            pAVar3->iprev = pAVar7->iprev;
          }
          pAVar7->inext = (AActor *)0x0;
          pAVar7->iprev = (AActor **)0x0;
        }
        pAVar7->tid = uVar2;
        if (uVar2 == 0) {
          pAVar7->inext = (AActor *)0x0;
          pAVar7->iprev = (AActor **)0x0;
        }
        else {
          ppAVar1 = AActor::TIDHash + (uVar2 & 0x7f);
          pAVar3 = *ppAVar1;
          pAVar7->inext = pAVar3;
          pAVar7->iprev = ppAVar1;
          *ppAVar1 = pAVar7;
          if (pAVar3 != (AActor *)0x0) {
            pAVar3->iprev = &pAVar7->inext;
          }
        }
        return 0;
      }
      pcVar8 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0xc9e,
                  "int AF_AActor_ChangeTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0042df3c:
  pcVar8 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0042df4c:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0xc9d,"int AF_AActor_ChangeTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, ChangeTid)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(tid);
	self->RemoveFromHash();
	self->tid = tid;
	self->AddToHash();
	return 0;
}